

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O3

int do_cmp(void)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  vm_register *pvVar6;
  undefined4 *puVar7;
  int iVar8;
  
  pvVar6 = registe_ptr;
  uVar2 = registe_ptr->IP;
  bVar1 = code_ptr[uVar2 + 2];
  bVar3 = bVar1 >> 4;
  if (code_ptr[uVar2 + 1] == '\x01') {
    iVar8 = *register_list[bVar3] - (int)code_ptr[uVar2 + 3];
  }
  else {
    if (code_ptr[uVar2 + 1] != '\0') {
LAB_0010353e:
      puVar7 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar7 = 0xf6;
      __cxa_throw(puVar7,&int::typeinfo,0);
    }
    bVar4 = (byte)code_ptr[uVar2 + 3] >> 4;
    if ((bVar1 & 0xf) != 2) {
      if ((bVar1 & 0xf) == 1) {
        uVar2 = *register_list[bVar3];
        uVar5 = *register_list[bVar4];
        if ((short)uVar2 == (short)uVar5) goto LAB_00103525;
        registe_ptr->flag[0] = '\x01';
        if ((short)((short)uVar2 - (short)uVar5) < 1) goto LAB_00103503;
        goto LAB_00103533;
      }
      if ((bVar1 & 0xf) != 0) goto LAB_0010353e;
      uVar2 = *register_list[bVar3];
      uVar5 = *register_list[bVar4];
      if ((char)uVar2 != (char)uVar5) {
        registe_ptr->flag[0] = '\x01';
        if ((char)((char)uVar2 - (char)uVar5) < '\x01') goto LAB_00103503;
        goto LAB_00103533;
      }
      goto LAB_00103525;
    }
    iVar8 = *register_list[bVar3] - *register_list[bVar4];
  }
  if (iVar8 != 0) {
    registe_ptr->flag[0] = '\x01';
    if (iVar8 < 1) {
LAB_00103503:
      pvVar6->flag[1] = '\0';
      return 1;
    }
LAB_00103533:
    pvVar6->flag[1] = '\x01';
    return 1;
  }
LAB_00103525:
  registe_ptr->flag[0] = '\0';
  return 1;
}

Assistant:

int do_cmp() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;
	if (code_ptr[registe_ptr->IP + 1] == '\x00') {//寄存器比较
			uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
			if (low == 0) {
				char*Ra = (char *)register_list[high];
				char*Rb = (char*)register_list[highb];
				char temp = *Ra - *Rb;
				set_flag(temp);
			}
			else if (low == 1)
			{
				int16_t*Ra = (int16_t *)register_list[high];
				int16_t*Rb = (int16_t *)register_list[highb];
				int16_t temp = *Ra - *Rb;
				set_flag(temp);
			}
			else if (low == 2)
			{
				unsigned*Ra = (unsigned *)register_list[high];
				unsigned*Rb = (unsigned*)register_list[highb];
				unsigned temp = *Ra - *Rb;
				set_flag(temp);
			}
			else throw(LVM_EXECUTE_ERROR);
	}
	else if (code_ptr[registe_ptr->IP + 1] == '\x01') {//立即数比较
		unsigned i = code_ptr[registe_ptr->IP + 3];
		set_flag(*register_list[high] - i);
	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}